

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O0

int lisp_string_to_c_string(LispPTR Lisp,char *C,size_t length)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  DLword *pDVar3;
  ulong local_48;
  size_t i;
  char *dp;
  size_t l;
  char *base;
  OneDArray *arrayp;
  size_t length_local;
  char *C_local;
  LispPTR Lisp_local;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (Lisp >> 9)) ^ 2) & 0x7ff) == 0xe) {
    pLVar2 = NativeAligned4FromLAddr(Lisp);
    if ((ulong)(long)(int)pLVar2[2] < length) {
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar3 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        LVar1 = pLVar2[2];
        i = (size_t)C;
        l = (long)pDVar3 + (long)(int)(uint)(ushort)pLVar2[1];
        for (local_48 = 0; local_48 < (ulong)(long)(int)LVar1; local_48 = local_48 + 1) {
          *(undefined1 *)i = *(undefined1 *)(l ^ 3);
          i = i + 1;
          l = l + 1;
        }
        C[(int)pLVar2[2]] = '\0';
        C_local._4_4_ = 0;
      }
      else {
        C_local._4_4_ = -1;
      }
    }
    else {
      C_local._4_4_ = -1;
    }
  }
  else {
    C_local._4_4_ = -1;
  }
  return C_local._4_4_;
}

Assistant:

static int lisp_string_to_c_string(LispPTR Lisp, char *C, size_t length) {
  OneDArray *arrayp;
  char *base;

  if (GetTypeNumber(Lisp) != TYPE_ONED_ARRAY) { return (-1); }

  arrayp = (OneDArray *)NativeAligned4FromLAddr(Lisp);
  if (arrayp->fillpointer >= length) { return (-1); } /* too long */

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)NativeAligned2FromLAddr(arrayp->base)) + ((int)(arrayp->offset));
#ifndef BYTESWAP
      strncpy(C, base, arrayp->fillpointer);
#else
      {
        size_t l = arrayp->fillpointer;
        char *dp = C;
        for (size_t i = 0; i < l; i++) {
          *dp++ = (char)(GETBYTE(base++));
        }
      }
#endif /* BYTESWAP */

      C[arrayp->fillpointer] = '\0';
      return 0;
    default: return -1;
  }
}